

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O2

void CVmObjBigNum::parse_str_into(char *ext,char *str,size_t len,int radix)

{
  ushort uVar1;
  CVmBigNumCacheReg *pCVar2;
  CVmBigNumCache *pCVar3;
  wchar_t wVar4;
  int iVar5;
  char *new_ext;
  uint uVar6;
  char *src;
  char *pcVar7;
  bool bVar8;
  utf8_ptr p;
  char local_54;
  size_t rem;
  uint thdl;
  char dreg [7];
  
  if (radix == 0) {
    radix = radix_from_string(str,len);
    bVar8 = radix == 0x10;
  }
  else {
    bVar8 = false;
  }
  if (radix == 10) {
    parse_str_into(ext,str,len);
    return;
  }
  uVar1 = *(ushort *)ext;
  ext[4] = ext[4] & 0xf9;
  memset(ext + 5,0,(ulong)(uVar1 + 1 >> 1));
  p.p_ = str;
  rem = len;
  while (rem != 0) {
    wVar4 = utf8_ptr::s_getch(p.p_);
    iVar5 = is_space(wVar4);
    if (iVar5 == 0) {
      if (rem == 0) break;
      wVar4 = utf8_ptr::s_getch(p.p_);
      if (wVar4 == L'+') {
        local_54 = '\0';
      }
      else {
        if (rem == 0) break;
        wVar4 = utf8_ptr::s_getch(p.p_);
        local_54 = '\x01';
        if (wVar4 != L'-') break;
      }
      utf8_ptr::inc(&p,&rem);
      goto LAB_00230e6d;
    }
    utf8_ptr::inc(&p,&rem);
  }
  local_54 = '\0';
LAB_00230e6d:
  while (rem != 0) {
    wVar4 = utf8_ptr::s_getch(p.p_);
    iVar5 = is_space(wVar4);
    if (iVar5 == 0) {
      if (!(bool)(bVar8 & rem != 0)) break;
      wVar4 = utf8_ptr::s_getch(p.p_);
      if (wVar4 != L'0') break;
      wVar4 = utf8_ptr::s_getch_at(p.p_,1);
      if (wVar4 != L'x') {
        wVar4 = utf8_ptr::s_getch_at(p.p_,1);
        if (wVar4 != L'X') break;
      }
      utf8_ptr::inc(&p,&rem);
      utf8_ptr::inc(&p,&rem);
      break;
    }
    utf8_ptr::inc(&p,&rem);
  }
  new_ext = alloc_temp_reg((ulong)uVar1,&thdl);
  bVar8 = false;
  src = ext;
  while (rem != 0) {
    wVar4 = utf8_ptr::s_getch(p.p_);
    uVar6 = wVar4 + L'\xffffffd0';
    if (9 < uVar6) {
      if ((uint)(wVar4 + L'\xffffffbf') < 0x1a) {
        uVar6 = wVar4 + L'\xffffffc9';
      }
      else {
        if (0x19 < (uint)(wVar4 + L'\xffffff9f')) break;
        uVar6 = wVar4 + L'\xffffffa9';
      }
    }
    if (radix <= (int)uVar6) break;
    if (wVar4 != L'0') {
      bVar8 = true;
    }
    pcVar7 = src;
    if (bVar8) {
      dreg[4] = '\0';
      dreg[5] = '\0';
      dreg[6] = '\0';
      dreg[0] = '\x02';
      dreg[1] = '\0';
      dreg[2] = '\0';
      dreg[3] = '\0';
      set_uint_val(dreg,(ulong)uVar6);
      mul_by_long(src,(ulong)(uint)radix);
      compute_abs_sum_into(new_ext,src,dreg);
      pcVar7 = new_ext;
      new_ext = src;
    }
    utf8_ptr::inc(&p,&rem);
    src = pcVar7;
  }
  if (src != ext) {
    copy_val(ext,src,0);
  }
  pCVar3 = S_bignum_cache;
  pCVar2 = S_bignum_cache->reg_;
  pCVar2[thdl].nxt_ = S_bignum_cache->free_reg_;
  pCVar3->free_reg_ = pCVar2 + thdl;
  ext[4] = (ext[4] & 0xfeU) + local_54;
  return;
}

Assistant:

void CVmObjBigNum::parse_str_into(char *ext, const char *str, size_t len,
                                  int radix)
{
    /* if the radix is 0, infer the radix from the string */
    int inferred_radix = 0;
    if (radix == 0)
        radix = inferred_radix = radix_from_string(str, len);
    
    /* if it's decimal, parse as a floating point value */
    if (radix == 10)
    {
        parse_str_into(ext, str, len);
        return;
    }

    /* get the precision */
    size_t prec = get_prec(ext);

    /* set the initial value to zero */
    set_type(ext, VMBN_T_NUM);
    memset(ext + VMBN_MANT, 0, (prec + 1)/2);

    /* set up to scan the string */
    utf8_ptr p((char *)str);
    size_t rem = len;

    /* skip leading spaces */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* check for a sign */
    int neg = FALSE;
    if (rem != 0 && p.getch() == '+')
    {
        /* skip the sign */
        p.inc(&rem);
    }
    else if (rem != 0 && p.getch() == '-')
    {
        /* note the sign and skip it */
        neg = TRUE;
        p.inc(&rem);
    }

    /* skip spaces after the sign */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* if we inferred the radix as hax, skip any '0x' marker */
    if (inferred_radix == 16
        && rem != 0
        && p.getch() == '0'
        && (p.getch_at(1) == 'x' || p.getch_at(1) == 'X'))
    {
        /* skip the '0x' prefix */
        p.inc(&rem);
        p.inc(&rem);
    }

    /* allocate a temporary register for swapping with the accumulator */
    uint thdl;
    char *tmp = alloc_temp_reg(prec, &thdl);
    char *t1 = ext, *t2 = tmp;

    /* parse the digits */
    int significant = FALSE;
    for ( ; rem != 0 ; p.inc(&rem))
    {
        /* get the next character */
        wchar_t ch = p.getch();

        /* get the digit value of this character */
        int d;
        if (ch >= '0' && ch <= '9')
            d = ch - '0';
        else if (ch >= 'A' && ch <= 'Z')
            d = ch - 'A' + 10;
        else if (ch >= 'a' && ch <= 'z')
            d = ch - 'a' + 10;
        else
            break;

        /* if the digit isn't within the radix, it's not a digit after all */
        if (d >= radix)
            break;

        /* if it's not a leading zero, it's significant */
        if (ch != '0')
            significant = TRUE;

        /* if it's a significant digit, add it to the accumulator */
        if (significant)
        {
            /* 
             *   Set up a stack register with the digit value.  The radix can
             *   be up to 36, so the digit value can be up to 35, so we need
             *   up to two decimal digits to represent the digit value. 
             */
            char dreg[5 + 2] = { 2, 0, 0, 0, 0 };
            set_uint_val(dreg, d);

            /* shift the accumulator and add the digit */
            mul_by_long(t1, radix);
            compute_abs_sum_into(t2, t1, dreg);

            /* swap the accumulators */
            char *tt = t1;
            t1 = t2;
            t2 = tt;
        }
    }

    /* if we ended up with the value in 'tmp', copy it into our result */
    if (t1 != ext)
        copy_val(ext, t1, FALSE);

    /* free our temporary register */
    release_temp_reg(thdl);

    /* set the sign */
    set_neg(ext, neg);
}